

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptNumber::ToStringRadixHelper(double value,int radix,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  WCHAR local_a38 [4];
  char16 szBuffer [1280];
  JavascriptString *string;
  ScriptContext *scriptContext_local;
  int radix_local;
  double value_local;
  
  if (radix == 10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x3dc,"(radix != 10)","radix != 10");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((radix < 2) || (0x24 < radix)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x3dd,"(radix >= 2 && radix <= 36)","radix >= 2 && radix <= 36");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  value_local = (double)ToStringNanOrInfiniteOrZero(value,scriptContext);
  if ((JavascriptString *)value_local == (JavascriptString *)0x0) {
    BVar3 = NumberUtilities::FNonZeroFiniteDblToStr(value,radix,local_a38,0x500);
    if (BVar3 == 0) {
      JavascriptError::ThrowOutOfMemoryError(scriptContext);
    }
    value_local = (double)JavascriptString::NewCopySz(local_a38,scriptContext);
  }
  return (JavascriptString *)value_local;
}

Assistant:

JavascriptString* JavascriptNumber::ToStringRadixHelper(double value, int radix, ScriptContext* scriptContext)
    {
        Assert(radix != 10);
        Assert(radix >= 2 && radix <= 36);

        JavascriptString* string = ToStringNanOrInfiniteOrZero(value, scriptContext);
        if (string != nullptr)
        {
            return string;
        }

        char16 szBuffer[bufSize];

        if (!Js::NumberUtilities::FNonZeroFiniteDblToStr(value, radix, szBuffer, _countof(szBuffer)))
        {
            Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
        }

        return JavascriptString::NewCopySz(szBuffer, scriptContext);
    }